

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item_Array.cxx
# Opt level: O2

int __thiscall Fl_Tree_Item_Array::deparent(Fl_Tree_Item_Array *this,int pos)

{
  Fl_Tree_Item *this_00;
  int iVar1;
  Fl_Tree_Item *this_01;
  Fl_Tree_Item *this_02;
  int iVar2;
  ulong uVar3;
  
  iVar2 = -1;
  if ((-1 < pos) && (pos < this->_total)) {
    this_00 = this->_items[(uint)pos];
    this_01 = Fl_Tree_Item::prev_sibling(this_00);
    this_02 = Fl_Tree_Item::next_sibling(this_00);
    iVar1 = this->_total + -1;
    this->_total = iVar1;
    uVar3 = (ulong)(uint)pos;
    iVar2 = pos;
    while( true ) {
      if (iVar1 <= iVar2) break;
      this->_items[uVar3] = this->_items[uVar3 + 1];
      iVar2 = iVar2 + 1;
      uVar3 = uVar3 + 1;
    }
    Fl_Tree_Item::update_prev_next(this_00,-1);
    if (this_01 != (Fl_Tree_Item *)0x0) {
      Fl_Tree_Item::update_prev_next(this_01,pos + -1);
    }
    iVar2 = 0;
    if (this_02 != (Fl_Tree_Item *)0x0) {
      Fl_Tree_Item::update_prev_next(this_02,pos);
    }
  }
  return iVar2;
}

Assistant:

int Fl_Tree_Item_Array::deparent(int pos) {
  if ( pos>=_total || pos<0 ) return -1;
  // Save item being deparented, and its two nearest siblings
  Fl_Tree_Item *item = _items[pos];
  Fl_Tree_Item *prev = item->prev_sibling();
  Fl_Tree_Item *next = item->next_sibling();
  // Remove from parent's list of children
  _total -= 1;
  for ( int t=pos; t<_total; t++ )
    _items[t] = _items[t+1];            // delete, no destroy
  // Now an orphan: remove association with old parent and siblings
  item->update_prev_next(-1);           // become an orphan
  // Adjust bereaved siblings
  if ( prev ) prev->update_prev_next(pos-1);
  if ( next ) next->update_prev_next(pos);
  return 0;
}